

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawLoader.cpp
# Opt level: O1

void __thiscall
Assimp::RAWImporter::InternReadFile
          (RAWImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  float *pfVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  byte bVar4;
  pointer paVar5;
  iterator iVar6;
  bool bVar7;
  pointer pGVar8;
  aiScene *paVar9;
  aiNode **ppaVar10;
  int iVar11;
  uint uVar12;
  GroupInformation *outGroup;
  undefined4 extraout_var;
  char *this_00;
  Logger *this_01;
  undefined8 uVar13;
  aiNode *paVar14;
  aiMesh **ppaVar15;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *__s;
  uint *puVar16;
  aiMesh *paVar17;
  long lVar18;
  aiVector3D *__s_00;
  long lVar19;
  aiColor4D *__s_01;
  ulong *puVar20;
  uint *puVar21;
  aiMaterial *this_02;
  long *plVar22;
  runtime_error *prVar23;
  pointer paVar24;
  size_type *psVar25;
  ulong uVar26;
  aiFace *paVar27;
  uint uVar28;
  iterator iVar29;
  pointer pMVar30;
  aiMaterial **ppaVar31;
  pointer paVar32;
  ulong uVar33;
  byte *pbVar34;
  pointer pMVar35;
  MeshInformation *mesh;
  pointer paVar36;
  ulong uVar37;
  aiFace *paVar38;
  vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
  *__range3;
  float data [12];
  vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
  outGroups;
  vector<char,_std::allocator<char>_> mBuffer2;
  aiColor4D v;
  char line [4096];
  undefined1 local_1508 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_14f8;
  IOStream *local_14e8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_14e0;
  pointer local_14d8;
  aiMaterial **local_14d0;
  undefined1 local_14c8 [8];
  float fStack_14c0;
  undefined4 uStack_14bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_14b8;
  float local_14a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_14a4;
  float local_149c;
  pointer local_1490;
  vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
  local_1488;
  aiScene *local_1470;
  vector<char,_std::allocator<char>_> local_1468;
  aiNode **local_1450;
  pointer local_1448;
  undefined1 local_1440 [12];
  char acStack_1434 [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1430;
  vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
  local_1420;
  pointer local_1408;
  pointer local_13f8;
  GroupInformation local_1038 [73];
  
  paVar2 = &local_1038[0].name.field_2;
  local_1470 = pScene;
  local_1038[0].name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"rb","");
  iVar11 = (*pIOHandler->_vptr_IOSystem[4])
                     (pIOHandler,(pFile->_M_dataplus)._M_p,local_1038[0].name._M_dataplus._M_p);
  local_14e8 = (IOStream *)CONCAT44(extraout_var,iVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0].name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1038[0].name._M_dataplus._M_p,
                    local_1038[0].name.field_2._M_allocated_capacity + 1);
  }
  if (local_14e8 == (IOStream *)0x0) {
    prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1440,
                   "Failed to open RAW file ",pFile);
    plVar22 = (long *)std::__cxx11::string::append(local_1440);
    local_1038[0].name._M_dataplus._M_p = (pointer)*plVar22;
    psVar25 = (size_type *)(plVar22 + 2);
    if ((size_type *)local_1038[0].name._M_dataplus._M_p == psVar25) {
      local_1038[0].name.field_2._0_8_ = *psVar25;
      local_1038[0].name.field_2._8_8_ = plVar22[3];
      local_1038[0].name._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1038[0].name.field_2._0_8_ = *psVar25;
    }
    local_1038[0].name._M_string_length = plVar22[1];
    *plVar22 = (long)psVar25;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    std::runtime_error::runtime_error(prVar23,(string *)local_1038);
    *(undefined ***)prVar23 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1468.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1468.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1468.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  BaseImporter::TextFileToBuffer(local_14e8,&local_1468,FORBID_EMPTY);
  pbVar34 = (byte *)local_1468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  local_1440._0_8_ = &local_1430;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1440,"<default>","");
  GroupInformation::GroupInformation(local_1038,(string *)local_1440);
  std::
  vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
  ::vector(&local_1488,1,local_1038,(allocator_type *)local_14c8);
  std::
  vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
  ::~vector(&local_1038[0].meshes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0].name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1038[0].name._M_dataplus._M_p,
                    local_1038[0].name.field_2._M_allocated_capacity + 1);
  }
  pMVar30 = (pointer)local_1488.
                     super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1440._0_8_ != &local_1430) {
    operator_delete((void *)local_1440._0_8_,local_1430._M_allocated_capacity + 1);
    pMVar30 = (pointer)local_1488.
                       super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  }
LAB_0061eb8a:
  do {
    local_14e0 = &pMVar30->vertices;
    local_14d8 = pMVar30;
LAB_0061eb9e:
    pGVar8 = local_1488.
             super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = (char *)local_1038;
    bVar3 = *pbVar34;
    if (bVar3 != 0) {
      for (uVar26 = 0;
          (bVar4 = pbVar34[uVar26], (bVar4 < 0xe & (byte)(0x3401 >> (bVar4 & 0x1f))) == 0 &&
          (uVar26 < 0x1000)); uVar26 = uVar26 + 1) {
        *(byte *)((long)&local_1038[0].name._M_dataplus._M_p + uVar26) = bVar4;
      }
      *(undefined1 *)((long)&local_1038[0].name._M_dataplus._M_p + uVar26) = 0;
      pbVar34 = pbVar34 + uVar26;
      while ((*pbVar34 < 0xe && ((0x3400U >> (*pbVar34 & 0x1f) & 1) != 0))) {
        pbVar34 = pbVar34 + 1;
      }
    }
    if (bVar3 == 0) {
      paVar14 = (aiNode *)operator_new(0x478);
      paVar9 = local_1470;
      aiNode::aiNode(paVar14);
      paVar9->mRootNode = paVar14;
      (paVar14->mName).length = 9;
      builtin_strncpy((paVar14->mName).data,"<RawRoot>",10);
      local_1490 = (pointer)local_1488.
                            super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
      for (pMVar30 = (pointer)local_1488.
                              super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                              ._M_impl.super__Vector_impl_data._M_start;
          pMVar30 !=
          (pointer)local_1488.
                   super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pMVar30 = (pointer)&pMVar30->colors)
      {
        if ((((vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
               *)&pMVar30->vertices)->
            super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (((vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
               *)&pMVar30->vertices)->
            super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          puVar16 = &paVar9->mRootNode->mNumChildren;
          *puVar16 = *puVar16 + 1;
          paVar9->mNumMeshes =
               paVar9->mNumMeshes +
               (int)((ulong)((long)(((vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                                      *)&pMVar30->vertices)->
                                   super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(((vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                                     *)&pMVar30->vertices)->
                                  super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333;
        }
      }
      if ((ulong)paVar9->mNumMeshes == 0) {
        prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1440._0_8_ = &local_1430;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1440,
                   "RAW: No meshes loaded. The file seems to be corrupt or empty.","");
        std::runtime_error::runtime_error(prVar23,(string *)local_1440);
        *(undefined ***)prVar23 = &PTR__runtime_error_0082bce0;
        __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      ppaVar15 = (aiMesh **)operator_new__((ulong)paVar9->mNumMeshes << 3);
      __s = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&paVar9->mRootNode;
      paVar9->mMeshes = ppaVar15;
      paVar14 = paVar9->mRootNode;
      local_1450 = (aiNode **)__s;
      if ((ulong)paVar14->mNumChildren == 1) {
        paVar14->mNumChildren = 0;
      }
      else {
        __s = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
              operator_new__((ulong)paVar14->mNumChildren << 3);
        memset(__s,0,(ulong)paVar14->mNumChildren << 3);
        paVar14->mChildren = (aiNode **)__s;
      }
      paVar9->mNumMaterials = paVar9->mNumMeshes;
      ppaVar31 = (aiMaterial **)operator_new__((ulong)paVar9->mNumMeshes << 3);
      paVar9->mMaterials = ppaVar31;
      if ((pointer)local_1488.
                   super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                   ._M_impl.super__Vector_impl_data._M_start != local_1490) {
        uVar28 = 0;
        pMVar30 = (pointer)local_1488.
                           super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        local_14e0 = __s;
        do {
          ppaVar10 = local_1450;
          local_1448 = pMVar30;
          if ((((vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                 *)&pMVar30->vertices)->
              super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
              )._M_impl.super__Vector_impl_data._M_start !=
              (((vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                 *)&pMVar30->vertices)->
              super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            if ((*local_1450)->mNumChildren == 0) {
              paVar14 = (aiNode *)
                        (__s->
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            }
            else {
              paVar14 = (aiNode *)operator_new(0x478);
              aiNode::aiNode(paVar14);
              (__s->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start = (pointer)paVar14;
              paVar14->mParent = *ppaVar10;
            }
            uVar26 = (pMVar30->name)._M_string_length;
            if (uVar26 < 0x400) {
              (paVar14->mName).length = (ai_uint32)uVar26;
              memcpy((paVar14->mName).data,(pMVar30->name)._M_dataplus._M_p,uVar26);
              (paVar14->mName).data[uVar26] = '\0';
            }
            uVar12 = (int)((long)(((vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                                    *)&pMVar30->vertices)->
                                 super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(((vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                                    *)&pMVar30->vertices)->
                                 super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x33333333;
            paVar14->mNumMeshes = uVar12;
            puVar16 = (uint *)operator_new__((ulong)uVar12 << 2);
            paVar14->mMeshes = puVar16;
            pMVar35 = (((vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                         *)&pMVar30->vertices)->
                      super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_14d8 = (((vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                            *)&pMVar30->vertices)->
                         super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
            if (pMVar35 != local_14d8) {
              do {
                if ((pMVar35->vertices).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
                    (pMVar35->vertices).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  __assert_fail("!(*it2).vertices.empty()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Raw/RawLoader.cpp"
                                ,0x114,
                                "virtual void Assimp::RAWImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                               );
                }
                *puVar16 = uVar28;
                local_14d0 = ppaVar31;
                paVar17 = (aiMesh *)operator_new(0x520);
                paVar17->mPrimitiveTypes = 0;
                paVar17->mNumVertices = 0;
                paVar17->mNumFaces = 0;
                memset(&paVar17->mVertices,0,0xcc);
                paVar17->mBones = (aiBone **)0x0;
                paVar17->mMaterialIndex = 0;
                (paVar17->mName).length = 0;
                (paVar17->mName).data[0] = '\0';
                memset((paVar17->mName).data + 1,0x1b,0x3ff);
                paVar17->mNumAnimMeshes = 0;
                paVar17->mAnimMeshes = (aiAnimMesh **)0x0;
                paVar17->mMethod = 0;
                (paVar17->mAABB).mMin.x = 0.0;
                (paVar17->mAABB).mMin.y = 0.0;
                (paVar17->mAABB).mMin.z = 0.0;
                (paVar17->mAABB).mMax.x = 0.0;
                (paVar17->mAABB).mMax.y = 0.0;
                (paVar17->mAABB).mMax.z = 0.0;
                paVar17->mTextureCoords[0] = (aiVector3D *)0x0;
                paVar17->mTextureCoords[1] = (aiVector3D *)0x0;
                paVar17->mTextureCoords[2] = (aiVector3D *)0x0;
                paVar17->mTextureCoords[3] = (aiVector3D *)0x0;
                paVar17->mTextureCoords[4] = (aiVector3D *)0x0;
                paVar17->mTextureCoords[5] = (aiVector3D *)0x0;
                paVar17->mTextureCoords[6] = (aiVector3D *)0x0;
                paVar17->mTextureCoords[7] = (aiVector3D *)0x0;
                paVar17->mNumUVComponents[0] = 0;
                paVar17->mNumUVComponents[1] = 0;
                paVar17->mNumUVComponents[2] = 0;
                paVar17->mNumUVComponents[3] = 0;
                paVar17->mNumUVComponents[4] = 0;
                paVar17->mNumUVComponents[5] = 0;
                paVar17->mNumUVComponents[6] = 0;
                paVar17->mNumUVComponents[7] = 0;
                paVar17->mColors[0] = (aiColor4D *)0x0;
                paVar17->mColors[1] = (aiColor4D *)0x0;
                paVar17->mColors[2] = (aiColor4D *)0x0;
                paVar17->mColors[3] = (aiColor4D *)0x0;
                paVar17->mColors[4] = (aiColor4D *)0x0;
                paVar17->mColors[5] = (aiColor4D *)0x0;
                paVar17->mColors[6] = (aiColor4D *)0x0;
                paVar17->mColors[7] = (aiColor4D *)0x0;
                local_1470->mMeshes[uVar28] = paVar17;
                paVar17->mMaterialIndex = uVar28;
                paVar17->mPrimitiveTypes = 4;
                lVar18 = (long)(pMVar35->vertices).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pMVar35->vertices).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                lVar19 = lVar18 >> 0x3f;
                uVar33 = (lVar18 / 6 + lVar19 >> 1) - lVar19;
                paVar17->mNumVertices = (uint)uVar33;
                uVar26 = uVar33 & 0xffffffff;
                __s_00 = (aiVector3D *)operator_new__(uVar26 * 0xc);
                if (uVar26 != 0) {
                  memset(__s_00,0,((uVar26 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
                }
                paVar17->mVertices = __s_00;
                uVar37 = uVar33 & 0xffffffff;
                memcpy(__s_00,(pMVar35->vertices).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,uVar37 * 0xc);
                lVar19 = (long)(pMVar35->colors).
                               super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pMVar35->colors).
                               super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                if (lVar19 != 0) {
                  if (lVar19 >> 4 != uVar37) {
                    __assert_fail("(*it2).colors.size() == mesh->mNumVertices",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Raw/RawLoader.cpp"
                                  ,0x124,
                                  "virtual void Assimp::RAWImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                                 );
                  }
                  __s_01 = (aiColor4D *)operator_new__(uVar37 << 4);
                  if ((uint)uVar33 != 0) {
                    memset(__s_01,0,uVar26 << 4);
                  }
                  paVar17->mColors[0] = __s_01;
                  memcpy(__s_01,(pMVar35->colors).
                                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                         (ulong)paVar17->mNumVertices << 4);
                }
                uVar12 = paVar17->mNumVertices;
                if (0x55555555 < uVar12 * -0x55555555) {
                  __assert_fail("0 == mesh->mNumVertices % 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Raw/RawLoader.cpp"
                                ,299,
                                "virtual void Assimp::RAWImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                               );
                }
                paVar17->mNumFaces = uVar12 / 3;
                uVar26 = (ulong)(uVar12 / 3);
                puVar20 = (ulong *)operator_new__(uVar26 * 0x10 + 8);
                *puVar20 = uVar26;
                paVar38 = (aiFace *)(puVar20 + 1);
                if (2 < uVar12) {
                  paVar27 = paVar38;
                  do {
                    paVar27->mNumIndices = 0;
                    paVar27->mIndices = (uint *)0x0;
                    paVar27 = paVar27 + 1;
                  } while (paVar27 != paVar38 + uVar26);
                }
                paVar17->mFaces = paVar38;
                if (2 < uVar12) {
                  iVar11 = 0;
                  do {
                    paVar38->mNumIndices = 3;
                    puVar21 = (uint *)operator_new__(0xc);
                    paVar27 = paVar38 + 1;
                    paVar38->mIndices = puVar21;
                    lVar19 = 0;
                    do {
                      paVar38->mIndices[lVar19] = iVar11 + (int)lVar19;
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 3);
                    iVar11 = iVar11 + 3;
                    paVar38 = paVar27;
                  } while (paVar27 != (aiFace *)(puVar20 + uVar26 * 2 + 1));
                }
                this_02 = (aiMaterial *)operator_new(0x10);
                aiMaterial::aiMaterial(this_02);
                local_14c8 = (undefined1  [8])0x3f8000003f800000;
                fStack_14c0 = 1.0;
                uStack_14bc = 0x3f800000;
                iVar11 = std::__cxx11::string::compare((char *)pMVar35);
                ppaVar31 = local_14d0;
                __s = local_14e0;
                if (iVar11 == 0) {
                  fStack_14c0 = 0.6;
                  local_14c8 = (undefined1  [8])0x3f19999a3f19999a;
                }
                else if ((pMVar35->name)._M_string_length != 0) {
                  local_1440._0_8_ = local_1440._0_8_ & 0xffffff0000000000;
                  memset(local_1440 + 5,0x1b,0x3ff);
                  uVar26 = (pMVar35->name)._M_string_length;
                  if (uVar26 < 0x400) {
                    local_1440._0_4_ = (int)uVar26;
                    memcpy(local_1440 + 4,(pMVar35->name)._M_dataplus._M_p,uVar26);
                    local_1440[uVar26 + 4] = 0;
                  }
                  aiMaterial::AddProperty(this_02,(aiString *)local_1440,"$tex.file",1,0);
                }
                aiMaterial::AddBinaryProperty
                          (this_02,local_14c8,0x10,"$clr.diffuse",0,0,aiPTI_Float);
                puVar16 = puVar16 + 1;
                uVar28 = uVar28 + 1;
                *ppaVar31 = this_02;
                ppaVar31 = ppaVar31 + 1;
                pMVar35 = pMVar35 + 1;
              } while (pMVar35 != local_14d8);
            }
          }
          pMVar30 = (pointer)&local_1448->colors;
        } while (pMVar30 != local_1490);
      }
      std::
      vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
      ::~vector(&local_1488);
      if ((byte *)local_1468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_1468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      (*local_14e8->_vptr_IOStream[1])();
      return;
    }
    while( true ) {
      bVar3 = *(byte *)&(((GroupInformation *)this_00)->name)._M_dataplus._M_p;
      uVar26 = (ulong)bVar3;
      if (0x20 < uVar26) break;
      if ((0x100000200U >> (uVar26 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar26 & 0x3f) & 1) != 0) goto LAB_0061eb9e;
        break;
      }
      this_00 = (char *)((long)&(((GroupInformation *)this_00)->name)._M_dataplus._M_p + 1);
    }
    if ((((byte)(bVar3 - 0x30) < 10) || (bVar3 == 0x2b)) || (bVar3 == 0x2d)) {
      ppaVar31 = (aiMaterial **)0x0;
LAB_0061ec42:
      do {
        bVar3 = *(byte *)&(((GroupInformation *)this_00)->name)._M_dataplus._M_p;
        uVar26 = (ulong)bVar3;
        if (uVar26 < 0x21) {
          if ((0x100000200U >> (uVar26 & 0x3f) & 1) != 0) {
            this_00 = (char *)((long)&(((GroupInformation *)this_00)->name)._M_dataplus._M_p + 1);
            goto LAB_0061ec42;
          }
          if ((0x3401UL >> (uVar26 & 0x3f) & 1) != 0) goto LAB_0061eca4;
        }
        if (((9 < (byte)(bVar3 - 0x30)) && (bVar3 != 0x2b)) && (bVar3 != 0x2d)) goto LAB_0061eca4;
        this_00 = fast_atoreal_move<float>
                            ((Assimp *)this_00,local_14c8 + (long)ppaVar31 * 4,(float *)0x1,
                             (bool)(bVar3 - 0x30));
        ppaVar31 = (aiMaterial **)((long)ppaVar31 + 1);
      } while (ppaVar31 != (aiMaterial **)0xc);
      ppaVar31 = (aiMaterial **)0xc;
LAB_0061eca4:
      iVar11 = (int)ppaVar31;
      if ((iVar11 == 9) || (iVar11 == 0xc)) {
        uVar28 = (uint)*(byte *)&(((GroupInformation *)this_00)->name)._M_dataplus._M_p;
        if ((uVar28 < 0xe) && ((0x3401U >> (uVar28 & 0x1f) & 1) != 0)) {
          this_00 = "";
          if (iVar11 == 9) {
            this_00 = "%default%";
          }
          uVar26 = (ulong)((uint)(iVar11 == 9) * 9);
        }
        else {
          uVar26 = 0;
          while ((uVar33 = (ulong)*(byte *)((long)&(((GroupInformation *)this_00)->name)._M_dataplus
                                                   ._M_p + uVar26), 0x20 < uVar33 ||
                 ((0x100003601U >> (uVar33 & 0x3f) & 1) == 0))) {
            uVar26 = uVar26 + 1;
          }
        }
        paVar36 = (local_14d8->vertices).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start;
        paVar5 = (local_14d8->vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_14d0 = ppaVar31;
        if (paVar36 == paVar5) {
          paVar24 = (pointer)0x0;
        }
        else {
          paVar32 = (pointer)0x0;
          do {
            if ((*(ulong *)&paVar36->z != (uVar26 & 0xffffffff)) ||
               ((bVar7 = true, paVar24 = paVar36, (int)uVar26 != 0 &&
                (iVar11 = strcmp(this_00,*(char **)paVar36), iVar11 != 0)))) {
              bVar7 = false;
              paVar24 = paVar32;
            }
          } while ((!bVar7) &&
                  (paVar36 = (pointer)&paVar36[6].z, paVar32 = paVar24, paVar36 != paVar5));
        }
        if (paVar24 == (pointer)0x0) {
          local_1508._0_8_ = &local_14f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1508,this_00,
                     (undefined1 *)
                     ((long)&(((GroupInformation *)this_00)->name)._M_dataplus._M_p +
                     (uVar26 & 0xffffffff)));
          MeshInformation::MeshInformation((MeshInformation *)local_1440,(string *)local_1508);
          std::
          vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
          ::emplace_back<Assimp::RAWImporter::MeshInformation>
                    ((vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                      *)local_14e0,(MeshInformation *)local_1440);
          pMVar30 = local_14d8;
          if (local_1408 != (pointer)0x0) {
            operator_delete(local_1408,(long)local_13f8 - (long)local_1408);
          }
          if (local_1420.
              super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1420.
                            super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1420.
                                  super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1420.
                                  super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1440._0_8_ != &local_1430) {
            operator_delete((void *)local_1440._0_8_,local_1430._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1508._0_8_ != &local_14f8) {
            operator_delete((void *)local_1508._0_8_,local_14f8._M_allocated_capacity + 1);
          }
          paVar24 = (pointer)&(pMVar30->vertices).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-7].y;
        }
        if ((int)local_14d0 == 0xc) {
          local_1440._0_8_ = local_14c8;
          local_1440._8_4_ = fStack_14c0;
          acStack_1434[0] = '\0';
          acStack_1434[1] = '\0';
          acStack_1434[2] = -0x80;
          acStack_1434[3] = '?';
          pfVar1 = &paVar24[4].z;
          iVar6._M_current = *(aiColor4t<float> **)&paVar24[5].y;
          if (iVar6._M_current == *(aiColor4t<float> **)(paVar24 + 6)) {
            std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
            _M_realloc_insert<aiColor4t<float>const&>
                      ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)pfVar1,iVar6,
                       (aiColor4t<float> *)local_1440);
          }
          else {
            (iVar6._M_current)->r = (float)local_14c8._0_4_;
            (iVar6._M_current)->g = (float)local_14c8._4_4_;
            (iVar6._M_current)->b = fStack_14c0;
            (iVar6._M_current)->a = 1.0;
            *(long *)&paVar24[5].y = *(long *)&paVar24[5].y + 0x10;
          }
          iVar6._M_current = *(aiColor4t<float> **)&paVar24[5].y;
          if (iVar6._M_current == *(aiColor4t<float> **)(paVar24 + 6)) {
            std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
            _M_realloc_insert<aiColor4t<float>const&>
                      ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)pfVar1,iVar6,
                       (aiColor4t<float> *)local_1440);
          }
          else {
            (iVar6._M_current)->r = (float)local_1440._0_4_;
            (iVar6._M_current)->g = (float)local_1440._4_4_;
            (iVar6._M_current)->b = (float)local_1440._8_4_;
            (iVar6._M_current)->a = (float)acStack_1434;
            *(long *)&paVar24[5].y = *(long *)&paVar24[5].y + 0x10;
          }
          iVar6._M_current = *(aiColor4t<float> **)&paVar24[5].y;
          if (iVar6._M_current == *(aiColor4t<float> **)(paVar24 + 6)) {
            std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
            _M_realloc_insert<aiColor4t<float>const&>
                      ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)pfVar1,iVar6,
                       (aiColor4t<float> *)local_1440);
          }
          else {
            (iVar6._M_current)->r = (float)local_1440._0_4_;
            (iVar6._M_current)->g = (float)local_1440._4_4_;
            (iVar6._M_current)->b = (float)local_1440._8_4_;
            (iVar6._M_current)->a = (float)acStack_1434;
            *(long *)&paVar24[5].y = *(long *)&paVar24[5].y + 0x10;
          }
          pfVar1 = &paVar24[2].z;
          local_1508._8_4_ = aStack_14b8._M_allocated_capacity._4_4_;
          iVar29._M_current = *(aiVector3t<float> **)&paVar24[3].y;
          if (iVar29._M_current == *(aiVector3t<float> **)(paVar24 + 4)) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pfVar1,iVar29,
                       (aiVector3t<float> *)local_1508);
          }
          else {
            (iVar29._M_current)->z = (float)aStack_14b8._M_allocated_capacity._4_4_;
            (iVar29._M_current)->x = (float)uStack_14bc;
            (iVar29._M_current)->y = (float)aStack_14b8._0_4_;
            *(long *)&paVar24[3].y = *(long *)&paVar24[3].y + 0xc;
          }
          local_1508._0_8_ = aStack_14b8._8_8_;
          local_1508._8_4_ = local_14a8;
          iVar29._M_current = *(aiVector3t<float> **)&paVar24[3].y;
          if (iVar29._M_current == *(aiVector3t<float> **)(paVar24 + 4)) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pfVar1,iVar29,
                       (aiVector3t<float> *)local_1508);
          }
          else {
            (iVar29._M_current)->z = local_14a8;
            (iVar29._M_current)->x = (float)aStack_14b8._8_4_;
            (iVar29._M_current)->y = (float)aStack_14b8._12_4_;
            *(long *)&paVar24[3].y = *(long *)&paVar24[3].y + 0xc;
          }
          local_1508._0_8_ = local_14a4;
          local_1508._8_4_ = local_149c;
          iVar29._M_current = *(aiVector3t<float> **)&paVar24[3].y;
          if (iVar29._M_current != *(aiVector3t<float> **)(paVar24 + 4)) {
            (iVar29._M_current)->z = local_149c;
            uVar13 = local_14a4;
            goto LAB_0061f10f;
          }
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pfVar1,iVar29,
                     (aiVector3t<float> *)local_1508);
        }
        else {
          pfVar1 = &paVar24[2].z;
          local_1440._0_8_ = local_14c8;
          local_1440._8_4_ = fStack_14c0;
          iVar29._M_current = *(aiVector3t<float> **)&paVar24[3].y;
          if (iVar29._M_current == *(aiVector3t<float> **)(paVar24 + 4)) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pfVar1,iVar29,
                       (aiVector3t<float> *)local_1440);
          }
          else {
            (iVar29._M_current)->z = fStack_14c0;
            (iVar29._M_current)->x = (float)local_14c8._0_4_;
            (iVar29._M_current)->y = (float)local_14c8._4_4_;
            *(long *)&paVar24[3].y = *(long *)&paVar24[3].y + 0xc;
          }
          local_1440._8_4_ = aStack_14b8._M_allocated_capacity._4_4_;
          iVar29._M_current = *(aiVector3t<float> **)&paVar24[3].y;
          if (iVar29._M_current == *(aiVector3t<float> **)(paVar24 + 4)) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pfVar1,iVar29,
                       (aiVector3t<float> *)local_1440);
          }
          else {
            (iVar29._M_current)->z = (float)aStack_14b8._M_allocated_capacity._4_4_;
            (iVar29._M_current)->x = (float)uStack_14bc;
            (iVar29._M_current)->y = (float)aStack_14b8._0_4_;
            *(long *)&paVar24[3].y = *(long *)&paVar24[3].y + 0xc;
          }
          local_1440._0_8_ = aStack_14b8._8_8_;
          local_1440._8_4_ = local_14a8;
          iVar29._M_current = *(aiVector3t<float> **)&paVar24[3].y;
          if (iVar29._M_current == *(aiVector3t<float> **)(paVar24 + 4)) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pfVar1,iVar29,
                       (aiVector3t<float> *)local_1440);
          }
          else {
            (iVar29._M_current)->z = local_14a8;
            uVar13 = aStack_14b8._8_8_;
LAB_0061f10f:
            *(undefined8 *)iVar29._M_current = uVar13;
            *(long *)&paVar24[3].y = *(long *)&paVar24[3].y + 0xc;
          }
        }
      }
      else {
        this_01 = DefaultLogger::get();
        Logger::error(this_01,"A line may have either 9 or 12 floats and an optional texture");
      }
      goto LAB_0061eb9e;
    }
    uVar26 = 0;
    while ((uVar33 = (ulong)*(byte *)((long)&(((GroupInformation *)this_00)->name)._M_dataplus._M_p
                                     + uVar26), 0x20 < uVar33 ||
           ((0x100003601U >> (uVar33 & 0x3f) & 1) == 0))) {
      uVar26 = uVar26 + 1;
    }
    if (local_1488.
        super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1488.
        super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pMVar30 = (pointer)local_1488.
                         super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (((uVar26 & 0xffffffff) == (pMVar30->name)._M_string_length) &&
           (iVar11 = strcmp(this_00,(pMVar30->name)._M_dataplus._M_p), iVar11 == 0))
        goto LAB_0061eb8a;
        pMVar30 = (pointer)&pMVar30->colors;
      } while (pMVar30 != (pointer)pGVar8);
    }
    local_14c8 = (undefined1  [8])&aStack_14b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_14c8,this_00,
               (char *)((long)&(((GroupInformation *)this_00)->name)._M_dataplus._M_p +
                       (uVar26 & 0xffffffff)));
    GroupInformation::GroupInformation((GroupInformation *)local_1440,(string *)local_14c8);
    std::
    vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
    ::emplace_back<Assimp::RAWImporter::GroupInformation>
              (&local_1488,(GroupInformation *)local_1440);
    std::
    vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
    ::~vector(&local_1420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1440._0_8_ != &local_1430) {
      operator_delete((void *)local_1440._0_8_,local_1430._M_allocated_capacity + 1);
    }
    if (local_14c8 != (undefined1  [8])&aStack_14b8) {
      operator_delete((void *)local_14c8,
                      CONCAT44(aStack_14b8._M_allocated_capacity._4_4_,
                               aStack_14b8._M_allocated_capacity._0_4_) + 1);
    }
    pMVar30 = (pointer)((((pointer)
                         ((long)local_1488.
                                super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -0x50))->name).field_2.
                        _M_local_buf + 8);
  } while( true );
}

Assistant:

void RAWImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL) {
        throw DeadlyImportError( "Failed to open RAW file " + pFile + ".");
    }

    // allocate storage and copy the contents of the file to a memory buffer
    // (terminate it with zero)
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    // list of groups loaded from the file
    std::vector< GroupInformation > outGroups(1,GroupInformation("<default>"));
    std::vector< GroupInformation >::iterator curGroup = outGroups.begin();

    // now read all lines
    char line[4096];
    while (GetNextLine(buffer,line))
    {
        // if the line starts with a non-numeric identifier, it marks
        // the beginning of a new group
        const char* sz = line;SkipSpaces(&sz);
        if (IsLineEnd(*sz))continue;
        if (!IsNumeric(*sz))
        {
            const char* sz2 = sz;
            while (!IsSpaceOrNewLine(*sz2))++sz2;
            const unsigned int length = (unsigned int)(sz2-sz);

            // find an existing group with this name
            for (std::vector< GroupInformation >::iterator it = outGroups.begin(), end = outGroups.end();
                it != end;++it)
            {
                if (length == (*it).name.length() && !::strcmp(sz,(*it).name.c_str()))
                {
                    curGroup = it;sz2 = NULL;
                    break;
                }
            }
            if (sz2)
            {
                outGroups.push_back(GroupInformation(std::string(sz,length)));
                curGroup = outGroups.end()-1;
            }
        }
        else
        {
            // there can be maximally 12 floats plus an extra texture file name
            float data[12];
            unsigned int num;
            for (num = 0; num < 12;++num)
            {
                if(!SkipSpaces(&sz) || !IsNumeric(*sz))break;
                sz = fast_atoreal_move<float>(sz,data[num]);
            }
            if (num != 12 && num != 9)
            {
                ASSIMP_LOG_ERROR("A line may have either 9 or 12 floats and an optional texture");
                continue;
            }

            MeshInformation* output = NULL;

            const char* sz2 = sz;
            unsigned int length;
            if (!IsLineEnd(*sz))
            {
                while (!IsSpaceOrNewLine(*sz2))++sz2;
                length = (unsigned int)(sz2-sz);
            }
            else if (9 == num)
            {
                sz = "%default%";
                length = 9;
            }
            else
            {
                sz = "";
                length = 0;
            }

            // search in the list of meshes whether we have one with this texture
            for (auto &mesh : (*curGroup).meshes)
            {
                if (length == mesh.name.length() && (length ? !::strcmp(sz, mesh.name.c_str()) : true))
                {
                    output = &mesh;
                    break;
                }
            }
            // if we don't have the mesh, create it
            if (!output)
            {
                (*curGroup).meshes.push_back(MeshInformation(std::string(sz,length)));
                output = &((*curGroup).meshes.back());
            }
            if (12 == num)
            {
                aiColor4D v(data[0],data[1],data[2],1.0f);
                output->colors.push_back(v);
                output->colors.push_back(v);
                output->colors.push_back(v);

                output->vertices.push_back(aiVector3D(data[3],data[4],data[5]));
                output->vertices.push_back(aiVector3D(data[6],data[7],data[8]));
                output->vertices.push_back(aiVector3D(data[9],data[10],data[11]));
            }
            else
            {
                output->vertices.push_back(aiVector3D(data[0],data[1],data[2]));
                output->vertices.push_back(aiVector3D(data[3],data[4],data[5]));
                output->vertices.push_back(aiVector3D(data[6],data[7],data[8]));
            }
        }
    }

    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<RawRoot>");

    // count the number of valid groups
    // (meshes can't be empty)
    for (auto & outGroup : outGroups)
    {
        if (!outGroup.meshes.empty())
        {
            ++pScene->mRootNode->mNumChildren;
            pScene->mNumMeshes += (unsigned int) outGroup.meshes.size();
        }
    }

    if (!pScene->mNumMeshes)
    {
        throw DeadlyImportError("RAW: No meshes loaded. The file seems to be corrupt or empty.");
    }

    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    aiNode** cc;
    if (1 == pScene->mRootNode->mNumChildren)
    {
        cc = &pScene->mRootNode;
        pScene->mRootNode->mNumChildren = 0;
    } else {
        cc = new aiNode*[pScene->mRootNode->mNumChildren];
        memset(cc, 0, sizeof(aiNode*) * pScene->mRootNode->mNumChildren);
        pScene->mRootNode->mChildren = cc;
    }

    pScene->mNumMaterials = pScene->mNumMeshes;
    aiMaterial** mats = pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];

    unsigned int meshIdx = 0;
    for (auto & outGroup : outGroups)
    {
        if (outGroup.meshes.empty())continue;

        aiNode* node;
        if (pScene->mRootNode->mNumChildren)
        {
            node = *cc = new aiNode();
            node->mParent = pScene->mRootNode;
        }
        else node = *cc;
        node->mName.Set(outGroup.name);

        // add all meshes
        node->mNumMeshes = (unsigned int) outGroup.meshes.size();
        unsigned int* pi = node->mMeshes = new unsigned int[ node->mNumMeshes ];
        for (std::vector< MeshInformation >::iterator it2 = outGroup.meshes.begin(),
            end2 = outGroup.meshes.end(); it2 != end2; ++it2)
        {
            ai_assert(!(*it2).vertices.empty());

            // allocate the mesh
            *pi++ = meshIdx;
            aiMesh* mesh = pScene->mMeshes[meshIdx] = new aiMesh();
            mesh->mMaterialIndex = meshIdx++;

            mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

            // allocate storage for the vertex components and copy them
            mesh->mNumVertices = (unsigned int)(*it2).vertices.size();
            mesh->mVertices = new aiVector3D[ mesh->mNumVertices ];
            ::memcpy(mesh->mVertices,&(*it2).vertices[0],sizeof(aiVector3D)*mesh->mNumVertices);

            if ((*it2).colors.size())
            {
                ai_assert((*it2).colors.size() == mesh->mNumVertices);

                mesh->mColors[0] = new aiColor4D[ mesh->mNumVertices ];
                ::memcpy(mesh->mColors[0],&(*it2).colors[0],sizeof(aiColor4D)*mesh->mNumVertices);
            }

            // generate triangles
            ai_assert(0 == mesh->mNumVertices % 3);
            aiFace* fc = mesh->mFaces = new aiFace[ mesh->mNumFaces = mesh->mNumVertices/3 ];
            aiFace* const fcEnd = fc + mesh->mNumFaces;
            unsigned int n = 0;
            while (fc != fcEnd)
            {
                aiFace& f = *fc++;
                f.mIndices = new unsigned int[f.mNumIndices = 3];
                for (unsigned int m = 0; m < 3;++m)
                    f.mIndices[m] = n++;
            }

            // generate a material for the mesh
            aiMaterial* mat = new aiMaterial();

            aiColor4D clr(1.0f,1.0f,1.0f,1.0f);
            if ("%default%" == (*it2).name) // a gray default material
            {
                clr.r = clr.g = clr.b = 0.6f;
            }
            else if ((*it2).name.length() > 0) // a texture
            {
                aiString s;
                s.Set((*it2).name);
                mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(0));
            }
            mat->AddProperty<aiColor4D>(&clr,1,AI_MATKEY_COLOR_DIFFUSE);
            *mats++ = mat;
        }
    }
}